

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void search234_step(search234_state *state,int direction)

{
  int local_28;
  int local_24;
  node234_conflict *pnStack_20;
  int i;
  node234_conflict *node;
  int direction_local;
  search234_state *state_local;
  
  pnStack_20 = (node234_conflict *)state->_node;
  if (pnStack_20 == (node234_conflict *)0x0) {
    state->element = (void *)0x0;
    state->index = 0;
  }
  else {
    if (state->_last != -1) {
      if (direction == 0) {
        __assert_fail("direction",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                      ,0x27e,"void search234_step(search234_state *, int)");
      }
      if (pnStack_20 == (node234_conflict *)0x0) {
        __assert_fail("node",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                      ,0x27f,"void search234_step(search234_state *, int)");
      }
      if (direction < 1) {
        state->_hi = state->_last + -1;
      }
      else {
        state->_lo = state->_last + 1;
      }
      if (state->_hi < state->_lo) {
        for (local_24 = 0; local_24 < state->_lo; local_24 = local_24 + 1) {
          state->_base = pnStack_20->counts[local_24] + 1 + state->_base;
        }
        pnStack_20 = pnStack_20->kids[state->_lo];
        state->_node = pnStack_20;
        state->_last = -1;
      }
    }
    if (state->_last == -1) {
      state->_lo = 0;
      if (pnStack_20 == (node234_conflict *)0x0) {
        local_28 = 0;
      }
      else {
        local_28 = elements234(pnStack_20);
        local_28 = local_28 + -1;
      }
      state->_hi = local_28;
    }
    if (pnStack_20 == (node234_conflict *)0x0) {
      state->element = (void *)0x0;
      state->index = state->_base;
    }
    else {
      state->_last = (state->_lo + state->_hi) / 2;
      state->element = pnStack_20->elems[state->_last];
      state->index = state->_base + state->_last;
      for (local_24 = 0; local_24 <= state->_last; local_24 = local_24 + 1) {
        state->index = pnStack_20->counts[local_24] + state->index;
      }
    }
  }
  return;
}

Assistant:

void search234_step(search234_state *state, int direction)
{
    node234 *node = state->_node;
    int i;

    if (!node) {
        state->element = NULL;
        state->index = 0;
        return;
    }

    if (state->_last != -1) {
        /*
         * We're already pointing at some element of a node, so we
         * should restrict to the elements left or right of it,
         * depending on the requested search direction.
         */
        assert(direction);
        assert(node);

        if (direction > 0)
            state->_lo = state->_last + 1;
        else
            state->_hi = state->_last - 1;

        if (state->_lo > state->_hi) {
            /*
             * We've run out of elements in this node, i.e. we've
             * narrowed to nothing but a child pointer. Descend to
             * that child, and update _base to the leftmost index of
             * its subtree.
             */
            for (i = 0; i < state->_lo; i++)
                state->_base += 1 + node->counts[i];
            state->_node = node = node->kids[state->_lo];
            state->_last = -1;
        }
    }

    if (state->_last == -1) {
        /*
         * We've just entered a new node - either because of the above
         * code, or because we were called from search234_start - and
         * anything in that node is a viable answer.
         */
        state->_lo = 0;
        state->_hi = node ? elements234(node)-1 : 0;
    }

    /*
     * Now we've got something we can return.
     */
    if (!node) {
        state->element = NULL;
        state->index = state->_base;
    } else {
        state->_last = (state->_lo + state->_hi) / 2;
        state->element = node->elems[state->_last];
        state->index = state->_base + state->_last;
        for (i = 0; i <= state->_last; i++)
            state->index += node->counts[i];
    }
}